

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_12,_12>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  undefined8 *puVar2;
  float *pfVar3;
  long lVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  long lVar7;
  int col_1;
  long lVar8;
  int col;
  undefined4 uVar9;
  Matrix<float,_3,_4> retVal;
  Vec4 *local_d0;
  ulong local_c8;
  float local_c0 [6];
  float local_a8 [4];
  undefined8 local_98;
  float fStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  float fStack_84;
  undefined8 uStack_80;
  Vector<float,_3> res_1;
  undefined8 uStack_68;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Type in1;
  
  puVar2 = &uStack_68;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      lVar8 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar4 != lVar8) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar8) = uVar9;
        lVar8 = lVar8 + 0xc;
      } while (lVar8 != 0x30);
      lVar7 = lVar7 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar4 = lVar4 + 0xc;
    } while (lVar7 != 3);
    uStack_68 = *(undefined8 *)evalCtx->in[0].m_data;
    res_2.m_data[0] = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    res_2.m_data[1] = (float)uVar1;
    res_2.m_data[2] = (float)((ulong)uVar1 >> 0x20);
    in1.m_data.m_data[0].m_data[0] = (float)((ulong)*(undefined8 *)evalCtx->in[3].m_data >> 0x20);
    in1.m_data.m_data[0].m_data[1] = evalCtx->in[3].m_data[2];
  }
  else {
    in1.m_data.m_data[0].m_data[0] = 0.0;
    in1.m_data.m_data[0].m_data[1] = 0.0;
    res_2.m_data[2] = 0.0;
    uStack_68 = 0;
    res_2.m_data[0] = 0.0;
    res_2.m_data[1] = 0.0;
    puVar5 = &sr::(anonymous_namespace)::s_constInMat4x3;
    lVar4 = 0;
    do {
      lVar7 = 0;
      puVar6 = puVar2;
      do {
        *(undefined4 *)puVar6 = puVar5[lVar7];
        lVar7 = lVar7 + 1;
        puVar6 = (undefined8 *)((long)puVar6 + 0xc);
      } while (lVar7 != 4);
      lVar4 = lVar4 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      puVar5 = puVar5 + 4;
    } while (lVar4 != 3);
  }
  puVar2 = &local_98;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      lVar8 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar4 != lVar8) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar8) = uVar9;
        lVar8 = lVar8 + 0xc;
      } while (lVar8 != 0x30);
      lVar7 = lVar7 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar4 = lVar4 + 0xc;
    } while (lVar7 != 3);
    local_98 = *(undefined8 *)evalCtx->in[0].m_data;
    fStack_90 = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_8c = (undefined4)uVar1;
    uStack_88 = (undefined4)((ulong)uVar1 >> 0x20);
    fStack_84 = evalCtx->in[1].m_data[2];
    uStack_80 = *(undefined8 *)evalCtx->in[2].m_data;
    res_1.m_data[0] = evalCtx->in[2].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[3].m_data;
    res_1.m_data[1] = (float)uVar1;
    res_1.m_data[2] = (float)((ulong)uVar1 >> 0x20);
  }
  else {
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    res_1.m_data[2] = 0.0;
    uStack_88 = 0;
    fStack_84 = 0.0;
    uStack_80 = 0;
    local_98 = 0;
    fStack_90 = 0.0;
    uStack_8c = 0;
    puVar5 = &DAT_00b4c450;
    lVar4 = 0;
    do {
      lVar7 = 0;
      puVar6 = puVar2;
      do {
        *(undefined4 *)puVar6 = puVar5[lVar7];
        lVar7 = lVar7 + 1;
        puVar6 = (undefined8 *)((long)puVar6 + 0xc);
      } while (lVar7 != 4);
      lVar4 = lVar4 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      puVar5 = puVar5 + 4;
    } while (lVar4 != 3);
  }
  pfVar3 = in1.m_data.m_data[0].m_data + 2;
  in1.m_data.m_data[3].m_data[1] = 0.0;
  in1.m_data.m_data[3].m_data[2] = 0.0;
  in1.m_data.m_data[2].m_data[0] = 0.0;
  in1.m_data.m_data[2].m_data[1] = 0.0;
  in1.m_data.m_data[2].m_data[2] = 0.0;
  in1.m_data.m_data[3].m_data[0] = 0.0;
  in1.m_data.m_data[0].m_data[2] = 0.0;
  in1.m_data.m_data[1].m_data[0] = 0.0;
  in1.m_data.m_data[1].m_data[1] = 0.0;
  in1.m_data.m_data[1].m_data[2] = 0.0;
  lVar4 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar4 != lVar8) {
        uVar9 = 0;
      }
      *(undefined4 *)((long)pfVar3 + lVar8) = uVar9;
      lVar8 = lVar8 + 0xc;
    } while (lVar8 != 0x30);
    lVar7 = lVar7 + 1;
    pfVar3 = pfVar3 + 1;
    lVar4 = lVar4 + 0xc;
  } while (lVar7 != 3);
  pfVar3 = in1.m_data.m_data[0].m_data + 2;
  puVar2 = &local_98;
  puVar6 = &uStack_68;
  lVar4 = 0;
  do {
    lVar7 = 0;
    do {
      *(float *)((long)pfVar3 + lVar7) =
           *(float *)((long)puVar6 + lVar7) * *(float *)((long)puVar2 + lVar7);
      lVar7 = lVar7 + 0xc;
    } while (lVar7 != 0x30);
    lVar4 = lVar4 + 1;
    pfVar3 = pfVar3 + 1;
    puVar2 = (undefined8 *)((long)puVar2 + 4);
    puVar6 = (undefined8 *)((long)puVar6 + 4);
  } while (lVar4 != 3);
  local_a8[2] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  lVar4 = 0;
  do {
    local_a8[lVar4] =
         in1.m_data.m_data[0].m_data[lVar4 + 2] + in1.m_data.m_data[1].m_data[lVar4 + 2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_c8 = local_c8 & 0xffffffff00000000;
  local_d0 = (Vec4 *)0x0;
  lVar4 = 0;
  do {
    *(float *)((long)&local_d0 + lVar4 * 4) =
         local_a8[lVar4] + in1.m_data.m_data[2].m_data[lVar4 + 2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_c0[4] = 0.0;
  local_c0[2] = 0.0;
  local_c0[3] = 0.0;
  lVar4 = 0;
  do {
    local_c0[lVar4 + 2] =
         *(float *)((long)&local_d0 + lVar4 * 4) + in1.m_data.m_data[3].m_data[lVar4 + 2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_d0 = &evalCtx->color;
  local_c8 = 0x100000000;
  local_c0[0] = 2.8026e-45;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_d0 + lVar4 * 4)] = local_c0[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}